

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* CLI::detail::split_up
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *str,char delimiter)

{
  char *pcVar1;
  pointer pcVar2;
  long lVar3;
  size_t sVar4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var5;
  string value;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  trim(str);
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  do {
    if (str->_M_string_length == 0) {
      return __return_storage_ptr__;
    }
    lVar3 = ::std::__cxx11::string::find(-8,(ulong)(uint)(int)*(str->_M_dataplus)._M_p);
    pcVar1 = (str->_M_dataplus)._M_p;
    if (lVar3 == -1) {
      _Var5 = ::std::
              __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::split_up(std::__cxx11::string,char)::_lambda(char)_1_>>
                        (pcVar1,pcVar1 + str->_M_string_length,delimiter);
      pcVar2 = (str->_M_dataplus)._M_p;
      if (_Var5._M_current == pcVar2 + str->_M_string_length) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,str);
        goto LAB_0013aabd;
      }
      value._M_dataplus._M_p = (pointer)&value.field_2;
      ::std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((string *)&value,pcVar2,_Var5._M_current);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,&value);
      local_50[0] = local_40;
      ::std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((string *)local_50,_Var5._M_current + 1,
                 (str->_M_dataplus)._M_p + str->_M_string_length);
      ::std::__cxx11::string::operator=((string *)str,(string *)local_50);
      ::std::__cxx11::string::~string((string *)local_50);
LAB_0013aa9b:
      ::std::__cxx11::string::~string((string *)&value);
    }
    else {
      lVar3 = ::std::__cxx11::string::find(-8,(ulong)(uint)(int)*pcVar1);
      sVar4 = close_sequence(str,0,*(char *)(matchBracketChars_abi_cxx11_ + lVar3));
      if (sVar4 < str->_M_string_length) {
        ::std::__cxx11::string::substr((ulong)&value,(ulong)str);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,&value);
        ::std::__cxx11::string::~string((string *)&value);
        if (sVar4 + 2 < str->_M_string_length) {
          ::std::__cxx11::string::substr((ulong)&value,(ulong)str);
          ::std::__cxx11::string::operator=((string *)str,(string *)&value);
          goto LAB_0013aa9b;
        }
      }
      else {
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,str);
      }
LAB_0013aabd:
      str->_M_string_length = 0;
      *(str->_M_dataplus)._M_p = '\0';
    }
    trim(str);
  } while( true );
}

Assistant:

CLI11_INLINE std::vector<std::string> split_up(std::string str, char delimiter) {

    auto find_ws = [delimiter](char ch) {
        return (delimiter == '\0') ? std::isspace<char>(ch, std::locale()) : (ch == delimiter);
    };
    trim(str);

    std::vector<std::string> output;
    while(!str.empty()) {
        if(bracketChars.find_first_of(str[0]) != std::string::npos) {
            auto bracketLoc = bracketChars.find_first_of(str[0]);
            auto end = close_sequence(str, 0, matchBracketChars[bracketLoc]);
            if(end >= str.size()) {
                output.push_back(std::move(str));
                str.clear();
            } else {
                output.push_back(str.substr(0, end + 1));
                if(end + 2 < str.size()) {
                    str = str.substr(end + 2);
                } else {
                    str.clear();
                }
            }

        } else {
            auto it = std::find_if(std::begin(str), std::end(str), find_ws);
            if(it != std::end(str)) {
                std::string value = std::string(str.begin(), it);
                output.push_back(value);
                str = std::string(it + 1, str.end());
            } else {
                output.push_back(str);
                str.clear();
            }
        }
        trim(str);
    }
    return output;
}